

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

ON__UINT64 __thiscall ON_Buffer::Write(ON_Buffer *this,ON__UINT64 size,void *buffer)

{
  bool bVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  ulong local_78;
  void *local_68;
  ON__UINT64 sz;
  ON__UINT64 offset;
  ON__UINT64 malloc_size;
  ON__UINT64 max_malloc_size;
  ON__UINT64 page_size;
  ON__UINT64 header_size;
  ON__UINT64 padding_size;
  ON__UINT64 rc;
  void *buffer_local;
  ON__UINT64 size_local;
  ON_Buffer *this_local;
  
  if (size == 0) {
    this_local = (ON_Buffer *)0x0;
  }
  else if (buffer == (void *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
               ,0x3ff,"","size parameter > 0 and buffer parameter is null.");
    this_local = (ON_Buffer *)0x0;
  }
  else {
    bVar1 = SetCurrentSegment(this,true);
    if (bVar1) {
      padding_size = 0;
      rc = (ON__UINT64)buffer;
      buffer_local = (void *)size;
      while (buffer_local != (void *)0x0) {
        if (this->m_current_segment == (ON_BUFFER_SEGMENT *)0x0) {
          max_malloc_size = ON_MemoryPageSize();
          if (max_malloc_size < 0x1001) {
            max_malloc_size = 0x1000;
          }
          if ((this->m_last_segment == (ON_BUFFER_SEGMENT *)0x0) ||
             (this->m_last_segment->m_segment_position1 <= this->m_last_segment->m_segment_position0
             )) {
            local_78 = 0;
          }
          else {
            local_78 = (this->m_last_segment->m_segment_position1 -
                       this->m_last_segment->m_segment_position0) + 0x50;
          }
          offset = local_78;
          if (local_78 < max_malloc_size >> 1) {
            offset = max_malloc_size >> 1;
          }
          if (offset < max_malloc_size << 4) {
            offset = offset << 1;
          }
          for (; offset < max_malloc_size << 4 && (void *)(offset - 0x50) < buffer_local;
              offset = offset << 1) {
          }
          pOVar2 = (ON_BUFFER_SEGMENT *)onmalloc(offset - 0x20);
          this->m_current_segment = pOVar2;
          memset(this->m_current_segment,0,offset - 0x20);
          this->m_current_segment->m_prev_segment = this->m_last_segment;
          this->m_current_segment->m_segment_buffer = (uchar *)(this->m_current_segment + 1);
          if (this->m_last_segment == (ON_BUFFER_SEGMENT *)0x0) {
            this->m_first_segment = this->m_current_segment;
          }
          else {
            this->m_last_segment->m_next_segment = this->m_current_segment;
            this->m_current_segment->m_segment_position0 = this->m_last_segment->m_segment_position1
            ;
          }
          this->m_last_segment = this->m_current_segment;
          this->m_current_segment->m_segment_position1 =
               this->m_current_segment->m_segment_position0 + (offset - 0x50);
        }
        if ((this->m_current_position < this->m_current_segment->m_segment_position0) ||
           (this->m_current_segment->m_segment_position1 <=
            this->m_current_segment->m_segment_position0)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x437,"","Corrupt ON_Buffer");
          return 0;
        }
        if (this->m_current_position < this->m_current_segment->m_segment_position1) {
          local_68 = (void *)(this->m_current_segment->m_segment_position1 -
                             this->m_current_position);
          if (buffer_local < local_68) {
            local_68 = buffer_local;
          }
          memcpy(this->m_current_segment->m_segment_buffer +
                 (this->m_current_position - this->m_current_segment->m_segment_position0),
                 (void *)rc,(size_t)local_68);
          this->m_current_position = (long)local_68 + this->m_current_position;
          if (this->m_buffer_size < this->m_current_position) {
            this->m_buffer_size = this->m_current_position;
          }
          padding_size = (long)local_68 + padding_size;
          buffer_local = (void *)((long)buffer_local - (long)local_68);
          rc = rc + (long)local_68;
          if (buffer_local != (void *)0x0) {
            this->m_current_segment = this->m_current_segment->m_next_segment;
          }
        }
        else {
          if (this->m_buffer_size < this->m_current_segment->m_segment_position1) {
            this->m_buffer_size = this->m_current_segment->m_segment_position1;
          }
          this->m_current_segment = this->m_current_segment->m_next_segment;
        }
      }
      this_local = (ON_Buffer *)padding_size;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x405,"","Corrupt ON_Buffer");
      this_local = (ON_Buffer *)0x0;
    }
  }
  return (ON__UINT64)this_local;
}

Assistant:

ON__UINT64 ON_Buffer::Write( ON__UINT64 size, const void* buffer )
{
  if ( 0 == size )
    return 0; // not an error condition

  if ( 0 == buffer )
  {
    ON_ERROR("size parameter > 0 and buffer parameter is null.");
    return 0;
  }

  if ( !SetCurrentSegment(true) )
  {
    ON_ERROR("Corrupt ON_Buffer");
    return 0;
  }

  // m_current_position >= m_buffer_size is ok - it is not an error condition.

  ON__UINT64 rc = 0;
  while ( size > 0 )
  {
    if ( 0 == m_current_segment )
    {
      // allocate a new segment
      const ON__UINT64 padding_size = 4*sizeof(void*); // room for os heap info
      const ON__UINT64 header_size = sizeof(*m_current_segment);
      ON__UINT64 page_size = ON_MemoryPageSize();
      if ( page_size <= 4096 )
        page_size = 4096;
      const ON__UINT64 max_malloc_size = 16*page_size;  // largest request we want to make

      ON__UINT64 malloc_size = ( 0 != m_last_segment && m_last_segment->m_segment_position1 > m_last_segment->m_segment_position0 )
                          ? padding_size + header_size + (m_last_segment->m_segment_position1 - m_last_segment->m_segment_position0)
                          : 0;
      if ( malloc_size < page_size/2 )
        malloc_size = page_size/2;      
      if ( malloc_size < max_malloc_size )
        malloc_size *= 2;
      while ( malloc_size < max_malloc_size && size > malloc_size - header_size - padding_size )
        malloc_size *= 2;

      malloc_size -= padding_size;
      // (size_t) cast is safe because malloc_size is always <= max_malloc_size = 16*page_size <  0xFFFFFFFF
      m_current_segment = (struct ON_BUFFER_SEGMENT*)onmalloc((size_t)malloc_size); 
      memset(m_current_segment,0,(size_t)malloc_size);
      m_current_segment->m_prev_segment = m_last_segment;
      m_current_segment->m_segment_buffer = (unsigned char*)(m_current_segment + 1);
      if ( 0 != m_last_segment )
      {
        m_last_segment->m_next_segment = m_current_segment;
        m_current_segment->m_segment_position0 = m_last_segment->m_segment_position1;
      }
      else
        m_first_segment = m_current_segment;
      m_last_segment = m_current_segment;
      m_current_segment->m_segment_position1 = m_current_segment->m_segment_position0 + (ON__UINT64)(malloc_size - header_size);
    }

    if (    m_current_position < m_current_segment->m_segment_position0 
         || m_current_segment->m_segment_position1 <= m_current_segment->m_segment_position0 
       )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return 0;
    }

    if ( m_current_position >= m_current_segment->m_segment_position1 )
    {
      // happens when a seek puts the current position beyond the end of the buffer.
      if ( m_current_segment->m_segment_position1 > m_buffer_size )
        m_buffer_size = m_current_segment->m_segment_position1;
      m_current_segment = m_current_segment->m_next_segment;
      continue;
    }
            
    ON__UINT64 offset = m_current_position - m_current_segment->m_segment_position0;
    ON__UINT64 sz = (m_current_segment->m_segment_position1 - m_current_position);

    if ( sz > size )
      sz = size;
    memcpy( m_current_segment->m_segment_buffer + offset, buffer, (size_t)sz );
    m_current_position += sz;
    if ( m_buffer_size < m_current_position )
    {
      // wrote past the old end of the file
      m_buffer_size = m_current_position;
    }
    rc += sz;
    size -= sz;
    buffer = ((const unsigned char*)buffer) + sz;
    if ( size > 0 )
      m_current_segment = m_current_segment->m_next_segment;
  }

  return rc;
}